

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O2

void color_cmyk_to_rgb(opj_image_t *image)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 OVar4;
  int iVar5;
  int iVar6;
  opj_image_comp_t *poVar7;
  OPJ_INT32 *pOVar8;
  OPJ_INT32 *pOVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  OPJ_UINT32 OVar17;
  OPJ_UINT32 OVar18;
  OPJ_UINT32 OVar19;
  OPJ_UINT32 OVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  float fVar24;
  
  if (3 < image->numcomps) {
    poVar7 = image->comps;
    OVar3 = poVar7->dx;
    if ((((OVar3 == poVar7[1].dx) && (OVar3 == poVar7[2].dx)) && (OVar3 == poVar7[3].dx)) &&
       (((OVar3 = poVar7->dy, OVar3 == poVar7[1].dy && (OVar3 == poVar7[2].dy)) &&
        (OVar3 == poVar7[3].dy)))) {
      OVar3 = poVar7->w;
      OVar4 = poVar7->h;
      OVar17 = poVar7->prec;
      OVar18 = poVar7[1].prec;
      OVar19 = poVar7[2].prec;
      OVar20 = poVar7[3].prec;
      for (uVar21 = 0; OVar3 * OVar4 != uVar21; uVar21 = uVar21 + 1) {
        pOVar8 = poVar7[1].data;
        iVar5 = pOVar8[uVar21];
        pOVar9 = poVar7[2].data;
        iVar6 = pOVar9[uVar21];
        fVar24 = 1.0 - (float)poVar7[3].data[uVar21] * (1.0 / (float)~(-1 << ((byte)OVar20 & 0x1f)))
        ;
        poVar7->data[uVar21] =
             (int)((1.0 - (float)poVar7->data[uVar21] *
                          (1.0 / (float)~(-1 << ((byte)OVar17 & 0x1f)))) * 255.0 * fVar24);
        pOVar8[uVar21] =
             (int)((1.0 - (float)iVar5 * (1.0 / (float)~(-1 << ((byte)OVar18 & 0x1f)))) * 255.0 *
                  fVar24);
        pOVar9[uVar21] =
             (int)((1.0 - (float)iVar6 * (1.0 / (float)~(-1 << ((byte)OVar19 & 0x1f)))) * 255.0 *
                  fVar24);
      }
      opj_image_data_free(poVar7[3].data);
      poVar7 = image->comps;
      poVar7[3].data = (OPJ_INT32 *)0x0;
      poVar7->prec = 8;
      poVar7[1].prec = 8;
      poVar7[2].prec = 8;
      uVar23 = image->numcomps - 1;
      image->numcomps = uVar23;
      image->color_space = OPJ_CLRSPC_SRGB;
      lVar22 = 0x100;
      for (uVar21 = 3; uVar21 < uVar23; uVar21 = uVar21 + 1) {
        poVar7 = image->comps;
        puVar2 = (undefined8 *)((long)&poVar7->dx + lVar22);
        uVar10 = *puVar2;
        uVar11 = puVar2[1];
        puVar2 = (undefined8 *)((long)&poVar7->x0 + lVar22);
        uVar12 = *puVar2;
        uVar13 = puVar2[1];
        puVar2 = (undefined8 *)((long)&poVar7->sgnd + lVar22);
        uVar14 = *puVar2;
        uVar15 = puVar2[1];
        puVar2 = (undefined8 *)((long)&poVar7->data + lVar22);
        uVar16 = puVar2[1];
        puVar1 = (undefined8 *)((long)poVar7 + lVar22 + -0x10);
        *puVar1 = *puVar2;
        puVar1[1] = uVar16;
        puVar2 = (undefined8 *)((long)poVar7 + lVar22 + -0x20);
        *puVar2 = uVar14;
        puVar2[1] = uVar15;
        puVar2 = (undefined8 *)((long)poVar7 + lVar22 + -0x30);
        *puVar2 = uVar12;
        puVar2[1] = uVar13;
        puVar2 = (undefined8 *)((long)&poVar7[-1].dx + lVar22);
        *puVar2 = uVar10;
        puVar2[1] = uVar11;
        uVar23 = image->numcomps;
        lVar22 = lVar22 + 0x40;
      }
      return;
    }
  }
  fprintf(_stderr,"%s:%d:color_cmyk_to_rgb\n\tCAN NOT CONVERT\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/bin/common/color.c"
          ,0x3ff);
  return;
}

Assistant:

void color_cmyk_to_rgb(opj_image_t *image)
{
    float C, M, Y, K;
    float sC, sM, sY, sK;
    unsigned int w, h, max, i;

    w = image->comps[0].w;
    h = image->comps[0].h;

    if (
        (image->numcomps < 4)
        || (image->comps[0].dx != image->comps[1].dx) ||
        (image->comps[0].dx != image->comps[2].dx) ||
        (image->comps[0].dx != image->comps[3].dx)
        || (image->comps[0].dy != image->comps[1].dy) ||
        (image->comps[0].dy != image->comps[2].dy) ||
        (image->comps[0].dy != image->comps[3].dy)
    ) {
        fprintf(stderr, "%s:%d:color_cmyk_to_rgb\n\tCAN NOT CONVERT\n", __FILE__,
                __LINE__);
        return;
    }

    max = w * h;

    sC = 1.0F / (float)((1 << image->comps[0].prec) - 1);
    sM = 1.0F / (float)((1 << image->comps[1].prec) - 1);
    sY = 1.0F / (float)((1 << image->comps[2].prec) - 1);
    sK = 1.0F / (float)((1 << image->comps[3].prec) - 1);

    for (i = 0; i < max; ++i) {
        /* CMYK values from 0 to 1 */
        C = (float)(image->comps[0].data[i]) * sC;
        M = (float)(image->comps[1].data[i]) * sM;
        Y = (float)(image->comps[2].data[i]) * sY;
        K = (float)(image->comps[3].data[i]) * sK;

        /* Invert all CMYK values */
        C = 1.0F - C;
        M = 1.0F - M;
        Y = 1.0F - Y;
        K = 1.0F - K;

        /* CMYK -> RGB : RGB results from 0 to 255 */
        image->comps[0].data[i] = (int)(255.0F * C * K); /* R */
        image->comps[1].data[i] = (int)(255.0F * M * K); /* G */
        image->comps[2].data[i] = (int)(255.0F * Y * K); /* B */
    }

    opj_image_data_free(image->comps[3].data);
    image->comps[3].data = NULL;
    image->comps[0].prec = 8;
    image->comps[1].prec = 8;
    image->comps[2].prec = 8;
    image->numcomps -= 1;
    image->color_space = OPJ_CLRSPC_SRGB;

    for (i = 3; i < image->numcomps; ++i) {
        memcpy(&(image->comps[i]), &(image->comps[i + 1]), sizeof(image->comps[i]));
    }

}